

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  float *pfVar1;
  uint uVar2;
  pointer pPVar3;
  pointer pPVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  float fVar8;
  Random rnd;
  allocator_type local_c9;
  float local_c8;
  float local_b8;
  float local_a8;
  float local_98;
  float local_88;
  vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> local_78;
  deRandom local_58;
  value_type local_48;
  
  deRandom_init(&local_58,
                *(uint *)&(this->m_data).field_0x24 ^
                *(uint *)&(this->m_data).super_DrawParamsBase.field_0x1c ^ 0xc2a39f);
  uVar6 = *(int *)&(this->m_data).super_DrawParamsBase.field_0x1c +
          *(int *)&(this->m_data).field_0x24;
  local_48.color.m_data[0] = 0.0;
  local_48.color.m_data[1] = 0.0;
  local_48.color.m_data[2] = 0.0;
  local_48.color.m_data[3] = 0.0;
  local_48.position.m_data[0] = 0.0;
  local_48.position.m_data[1] = 0.0;
  local_48.position.m_data[2] = 0.0;
  local_48.position.m_data[3] = 0.0;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector(&local_78,(ulong)uVar6,&local_48,&local_c9);
  pPVar3 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pPVar3 != (pointer)0x0) {
    operator_delete(pPVar3,(long)pPVar4 - (long)pPVar3);
    if (local_78.
        super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  uVar2 = *(uint *)&(this->m_data).field_0x24;
  if (uVar2 < uVar6) {
    lVar7 = (ulong)uVar6 - (ulong)uVar2;
    uVar5 = (ulong)uVar2 << 5 | 0x10;
    do {
      local_88 = deRandom_getFloat(&local_58);
      local_a8 = deRandom_getFloat(&local_58);
      local_98 = deRandom_getFloat(&local_58);
      local_b8 = deRandom_getFloat(&local_58);
      local_c8 = deRandom_getFloat(&local_58);
      fVar8 = deRandom_getFloat(&local_58);
      pPVar3 = (this->m_data).super_DrawParamsBase.vertices.
               super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar1 = (float *)((long)&pPVar3->position + uVar5 + -0x10);
      *pfVar1 = local_88 + local_88 + -1.0;
      pfVar1[1] = local_a8 + local_a8 + -1.0;
      pfVar1[2] = 1.0;
      pfVar1[3] = 1.0;
      pfVar1 = (float *)((long)&pPVar3->position + uVar5);
      *pfVar1 = local_98 + 0.0;
      pfVar1[1] = local_b8 + 0.0;
      pfVar1[2] = local_c8 + 0.0;
      pfVar1[3] = fVar8 + 0.0;
      uVar5 = uVar5 + 0x20;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void DrawTestInstance<DrawParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.params.firstVertex ^ m_data.params.vertexCount);

	const deUint32	vectorSize	= m_data.params.firstVertex + m_data.params.vertexCount;

	// Initialize the vector
	m_data.vertices = std::vector<PositionColorVertex>(vectorSize, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Fill only the used indexes
	for (deUint32 vertexIdx = m_data.params.firstVertex; vertexIdx < vectorSize; ++vertexIdx)
	{
		m_data.vertices[vertexIdx] = PositionColorVertex(
			tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0),										// Coord
			tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0)));	// Color
	}
}